

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_ul_setup(connectdata *conn,_Bool sizechecked)

{
  void *pvVar1;
  Curl_easy *data_00;
  CURLcode CVar2;
  size_t sVar3;
  char *fmt;
  ulong local_60;
  size_t actuallyread;
  size_t readthisamountnow;
  curl_off_t passed;
  int seekerr;
  ftp_conn *ftpc;
  Curl_easy *data;
  FTP *ftp;
  CURLcode result;
  _Bool sizechecked_local;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  data_00 = conn->data;
  if ((((data_00->state).resume_from != 0) && (!sizechecked)) ||
     ((0 < (data_00->state).resume_from && (sizechecked)))) {
    passed._4_4_ = 0;
    if ((data_00->state).resume_from < 0) {
      CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"SIZE %s",(conn->proto).ftpc.file);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      _state(conn,FTP_STOR_SIZE);
      return CURLE_OK;
    }
    (data_00->set).ftp_append = true;
    if (conn->seek_func != (curl_seek_callback)0x0) {
      Curl_set_in_callback(data_00,true);
      passed._4_4_ = (*conn->seek_func)(conn->seek_client,(data_00->state).resume_from,0);
      Curl_set_in_callback(data_00,false);
    }
    if (passed._4_4_ != 0) {
      readthisamountnow = 0;
      if (passed._4_4_ != 2) {
        Curl_failf(data_00,"Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      do {
        if ((data_00->set).buffer_size < (long)((data_00->state).resume_from - readthisamountnow)) {
          local_60 = (data_00->set).buffer_size;
        }
        else {
          local_60 = curlx_sotouz((data_00->state).resume_from - readthisamountnow);
        }
        sVar3 = (*(data_00->state).fread_func)
                          ((data_00->state).buffer,1,local_60,(data_00->state).in);
        readthisamountnow = sVar3 + readthisamountnow;
        if ((sVar3 == 0) || (local_60 < sVar3)) {
          Curl_failf(data_00,"Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while ((long)readthisamountnow < (data_00->state).resume_from);
    }
    if ((0 < (data_00->state).infilesize) &&
       ((data_00->state).infilesize = (data_00->state).infilesize - (data_00->state).resume_from,
       (data_00->state).infilesize < 1)) {
      Curl_infof(data_00,"File already completely uploaded\n");
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      *(undefined4 *)((long)pvVar1 + 0x28) = 2;
      _state(conn,FTP_STOP);
      return CURLE_OK;
    }
  }
  fmt = "STOR %s";
  if (((data_00->set).ftp_append & 1U) != 0) {
    fmt = "APPE %s";
  }
  CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,fmt,(conn->proto).ftpc.file);
  if (CVar2 == CURLE_OK) {
    _state(conn,FTP_STOR);
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct connectdata *conn,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we're about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       don't another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */
    int seekerr = CURL_SEEKFUNC_OK;

    if(data->state.resume_from < 0) {
      /* Got no given size to start from, figure it out */
      PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
      state(conn, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    data->set.ftp_append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(conn->seek_func) {
      Curl_set_in_callback(data, true);
      seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                SEEK_SET);
      Curl_set_in_callback(data, false);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      curl_off_t passed = 0;
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
      do {
        size_t readthisamountnow =
          (data->state.resume_from - passed > data->set.buffer_size) ?
          (size_t)data->set.buffer_size :
          curlx_sotouz(data->state.resume_from - passed);

        size_t actuallyread =
          data->state.fread_func(data->state.buffer, 1, readthisamountnow,
                                 data->state.in);

        passed += actuallyread;
        if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
          /* this checks for greater-than only to make sure that the
             CURL_READFUNC_ABORT return code still aborts */
          failf(data, "Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while(passed < data->state.resume_from);
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize>0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded\n");

        /* no data to transfer */
        Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

        /* Set ->transfer so that we won't get any error in
         * ftp_done() because we didn't transfer anything! */
        ftp->transfer = FTPTRANSFER_NONE;

        state(conn, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we've passed, proceed as normal */
  } /* resume_from */

  PPSENDF(&ftpc->pp, data->set.ftp_append?"APPE %s":"STOR %s",
          ftpc->file);

  state(conn, FTP_STOR);

  return result;
}